

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O1

qint64 __thiscall QNetworkReplyFileImpl::bytesAvailable(QNetworkReplyFileImpl *this)

{
  char cVar1;
  long lVar2;
  long lVar3;
  qint64 qVar4;
  
  lVar3 = *(long *)(this + 8);
  if ((((*(char *)(lVar3 + 0x22c) == '\x01') && (*(long *)(lVar3 + 0x238) != 0)) &&
      (*(int *)(*(long *)(lVar3 + 0x238) + 4) != 0)) && (*(long *)(lVar3 + 0x240) != 0)) {
    cVar1 = QIODevice::isOpen();
    if (cVar1 != '\0') {
      lVar2 = QIODevice::bytesAvailable();
      lVar3 = (**(code **)(**(long **)(lVar3 + 0x240) + 0xa0))();
      return lVar3 + lVar2;
    }
  }
  qVar4 = QIODevice::bytesAvailable();
  return qVar4;
}

Assistant:

qint64 QNetworkReplyFileImpl::bytesAvailable() const
{
    Q_D(const QNetworkReplyFileImpl);
    if (!d->isFinished || !d->realFile || !d->realFile->isOpen())
        return QNetworkReply::bytesAvailable();
    return QNetworkReply::bytesAvailable() + d->realFile->bytesAvailable();
}